

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsMacros.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
generateMipsMacroSet
          (Parser *parser,MipsRegisterData *registers,MipsImmediateData *immediates,int flags)

{
  uint uVar1;
  string *psVar2;
  undefined4 in_register_0000000c;
  uint in_R8D;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  initializer_list<AssemblyTemplateArgument> variables;
  AssemblyTemplateArgument *local_2e0;
  char *local_298;
  char *local_278;
  char *local_258;
  char *local_238;
  allocator<char> local_1f7;
  allocator<char> local_1f6;
  allocator<char> local_1f5 [20];
  allocator<char> local_1e1;
  AssemblyTemplateArgument *local_1e0;
  AssemblyTemplateArgument local_1d8;
  char *local_1b0;
  string asStack_1a8 [32];
  char *local_188;
  string asStack_180 [32];
  char *local_160;
  string asStack_158 [32];
  char *local_138;
  string local_130 [32];
  char *local_110;
  string local_108 [32];
  char *local_e8;
  string local_e0 [32];
  char *local_c0;
  string local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  string macroText;
  char *templateGe;
  char *templateImmediateGeLt;
  char *templateEqNe;
  char *templateImmediateEqNe;
  bool revcmp;
  bool immediate;
  bool unsigned_;
  bool lt;
  bool ge;
  bool eq;
  bool ne;
  int type;
  char *selectedTemplate;
  int flags_local;
  MipsImmediateData *immediates_local;
  MipsRegisterData *registers_local;
  Parser *parser_local;
  
  uVar1 = in_R8D & 7;
  bVar3 = uVar1 == 6;
  bVar4 = uVar1 != 4;
  bVar5 = uVar1 != 5;
  bVar6 = (in_R8D & 0x200) == 0;
  if ((bVar6) || ((uVar1 != 1 && (!bVar3)))) {
    if ((uVar1 == 1) || (bVar3)) {
      _lt = 
      "\n\t\t\txor\t\t%rd%,%rs%,%rt%\n\t\t\t.if %eq%\n\t\t\t\tsltiu\t%rd%,%rd%,1\n\t\t\t.else\n\t\t\t\tsltu\t%rd%,r0,%rd%\n\t\t\t.endif\n\t\t"
      ;
    }
    else if ((bVar6) || ((bVar4 && bVar5 && (uVar1 != 2 && uVar1 != 3)))) {
      if (bVar4 && bVar5) {
        std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
        unique_ptr<std::default_delete<CAssemblerCommand>,void>
                  ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
                   (nullptr_t)0x0);
        return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                )(__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>
                  )parser;
      }
      macroText.field_2._8_8_ = anon_var_dwarf_297a44;
      _lt = 
      "\n\t\t\t.if %revcmp%\n\t\t\t\tslt%u%\t%rd%,%rt%,%rs%\n\t\t\t.else\n\t\t\t\tslt%u%\t%rd%,%rs%,%rt%\n\t\t\t.endif\n\t\t\txori\t%rd%,%rd%,1\n\t\t"
      ;
    }
    else {
      _lt = 
      "\n\t\t\t.if %revcmp% && %imm% == 0\n\t\t\t\tslt%u%\t%rd%,r0,%rs%\n\t\t\t.elseif %revcmp%\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\tslt%u%\t%rd%,%rd%,%rs%\n\t\t\t.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\tslt%u%\t%rd%,%rs%,%rd%\n\t\t\t.else\n\t\t\t\tslti%u%\t%rd%,%rs%,%imm%\n\t\t\t.endif\n\t\t\t.if %ge%\n\t\t\t\txori\t%rd%,%rd%,1\n\t\t\t.endif\n\t\t"
      ;
    }
  }
  else {
    _lt = 
    "\n\t\t\t.if %imm% & ~0xFFFF\n\t\t\t\tli\t\t%rd%,%imm%\n\t\t\t\txor\t\t%rd%,%rs%,%rd%\n\t\t\t.else\n\t\t\t\txori\t%rd%,%rs%,%imm%\n\t\t\t.endif\n\t\t\t.if %eq%\n\t\t\t\tsltiu\t%rd%,%rd%,1\n\t\t\t.else\n\t\t\t\tsltu\t%rd%,r0,%rd%\n\t\t\t.endif\n\t\t"
    ;
  }
  preprocessMacro_abi_cxx11_
            ((string *)local_88,_lt,(MipsImmediateData *)CONCAT44(in_register_0000000c,flags));
  local_1e0 = &local_1d8;
  local_1d8.variableName = "%u%";
  if (uVar1 == 5 || uVar1 == 3) {
    local_238 = "u";
  }
  else {
    local_238 = " ";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8.value,local_238,&local_1e1);
  local_1e0 = (AssemblyTemplateArgument *)&local_1b0;
  local_1b0 = "%eq%";
  if (bVar3) {
    local_258 = "1";
  }
  else {
    local_258 = "0";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_1a8,local_258,local_1f5);
  local_1e0 = (AssemblyTemplateArgument *)&local_188;
  local_188 = "%ge%";
  if (bVar4 && bVar5) {
    local_278 = "0";
  }
  else {
    local_278 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_180,local_278,&local_1f6);
  local_1e0 = (AssemblyTemplateArgument *)&local_160;
  local_160 = "%revcmp%";
  if ((in_R8D & 0x80000) == 0) {
    local_298 = "0";
  }
  else {
    local_298 = "1";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(asStack_158,local_298,&local_1f7);
  local_1e0 = (AssemblyTemplateArgument *)&local_138;
  local_138 = "%rd%";
  psVar2 = Identifier::string_abi_cxx11_
                     ((Identifier *)&immediates[1].primary.expression.constExpression);
  std::__cxx11::string::string(local_130,(string *)psVar2);
  local_1e0 = (AssemblyTemplateArgument *)&local_110;
  local_110 = "%rs%";
  psVar2 = Identifier::string_abi_cxx11_((Identifier *)&(immediates->primary).expression);
  std::__cxx11::string::string(local_108,(string *)psVar2);
  local_1e0 = (AssemblyTemplateArgument *)&local_e8;
  local_e8 = "%rt%";
  psVar2 = Identifier::string_abi_cxx11_
                     ((Identifier *)
                      &(immediates->secondary).expression.expression.
                       super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount);
  std::__cxx11::string::string(local_e0,(string *)psVar2);
  local_1e0 = (AssemblyTemplateArgument *)&local_c0;
  local_c0 = "%imm%";
  Expression::toString_abi_cxx11_
            (&local_b8,
             &(((MipsImmediateData *)CONCAT44(in_register_0000000c,flags))->secondary).expression);
  variables._M_array = (iterator)(ulong)in_R8D;
  local_98._0_8_ = &local_1d8;
  local_98._8_8_ = 8;
  variables._M_len = local_98._0_8_;
  createMacro(parser,(string *)registers,(int)local_88,variables);
  local_2e0 = (AssemblyTemplateArgument *)local_98;
  do {
    local_2e0 = local_2e0 + -1;
    AssemblyTemplateArgument::~AssemblyTemplateArgument(local_2e0);
  } while (local_2e0 != &local_1d8);
  std::allocator<char>::~allocator(&local_1f7);
  std::allocator<char>::~allocator(&local_1f6);
  std::allocator<char>::~allocator(local_1f5);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string((string *)local_88);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> generateMipsMacroSet(Parser& parser, MipsRegisterData& registers, MipsImmediateData& immediates, int flags)
{
	const char* selectedTemplate;

	int type = flags & MIPSM_CONDITIONMASK;

	bool ne = type == MIPSM_NE;
	bool eq = type == MIPSM_EQ;
	bool ge = type == MIPSM_GE || type == MIPSM_GEU;
	bool lt = type == MIPSM_LT || type == MIPSM_LTU;
	bool unsigned_ = type == MIPSM_GEU || type == MIPSM_LTU;
	bool immediate = (flags & MIPSM_IMM) != 0;
	bool revcmp = (flags & MIPSM_REVCMP) != 0;

	if (immediate && (ne || eq))
	{
		const char* templateImmediateEqNe = R"(
			.if %imm% & ~0xFFFF
				li		%rd%,%imm%
				xor		%rd%,%rs%,%rd%
			.else
				xori	%rd%,%rs%,%imm%
			.endif
			.if %eq%
				sltiu	%rd%,%rd%,1
			.else
				sltu	%rd%,r0,%rd%
			.endif
		)";

		selectedTemplate = templateImmediateEqNe;
	} else if (ne || eq)
	{
		const char* templateEqNe = R"(
			xor		%rd%,%rs%,%rt%
			.if %eq%
				sltiu	%rd%,%rd%,1
			.else
				sltu	%rd%,r0,%rd%
			.endif
		)";

		selectedTemplate = templateEqNe;
	} else if (immediate && (ge || lt))
	{
		const char* templateImmediateGeLt = R"(
			.if %revcmp% && %imm% == 0
				slt%u%	%rd%,r0,%rs%
			.elseif %revcmp%
				li		%rd%,%imm%
				slt%u%	%rd%,%rd%,%rs%
			.elseif (%imm% < -0x8000) || (%imm% >= 0x8000)
				li		%rd%,%imm%
				slt%u%	%rd%,%rs%,%rd%
			.else
				slti%u%	%rd%,%rs%,%imm%
			.endif
			.if %ge%
				xori	%rd%,%rd%,1
			.endif
		)";

		selectedTemplate = templateImmediateGeLt;
	} else if (ge)
	{
		const char* templateGe = R"(
			.if %revcmp%
				slt%u%	%rd%,%rt%,%rs%
			.else
				slt%u%	%rd%,%rs%,%rt%
			.endif
			xori	%rd%,%rd%,1
		)";

		selectedTemplate = templateGe;
	} else
	{
		return nullptr;
	}

	std::string macroText = preprocessMacro(selectedTemplate,immediates);
	return createMacro(parser,macroText,flags, {
			{ "%u%",		unsigned_ ? "u" : " "},
			{ "%eq%",		eq ? "1" : "0" },
			{ "%ge%",		ge ? "1" : "0" },
			{ "%revcmp%",	revcmp ? "1" : "0" },
			{ "%rd%",		registers.grd.name.string() },
			{ "%rs%",		registers.grs.name.string() },
			{ "%rt%",		registers.grt.name.string() },
			{ "%imm%",		immediates.secondary.expression.toString() },
	});
}